

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O3

unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> __thiscall
amrex::get_slice_data
          (amrex *this,int dir,Real coord,MultiFab *cc,Geometry *geom,int start_comp,int ncomp,
          bool interpolate)

{
  Real *pRVar1;
  undefined8 uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  BaseFab<double> *this_00;
  BaseFab<double> *src;
  double *pdVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  BATType BVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  int iVar23;
  FabArrayBase *fabarray_;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  pair<int,_amrex::Box> *is;
  pointer __args;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uint uVar43;
  uint uVar45;
  ulong uVar44;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *slice;
  Vector<int,_std::allocator<int>_> slice_to_full_ba_map;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> boxes;
  Vector<int,_std::allocator<int>_> procs;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  DistributionMapping slice_dmap;
  Box lhs;
  RealBox real_slice;
  BoxArray slice_ba;
  BoxArray ba;
  ulong local_398;
  long local_390;
  long local_388;
  int local_378;
  double dStack_370;
  int local_360;
  int local_358;
  int local_350;
  uint local_348;
  uint uStack_344;
  double dStack_340;
  long local_300;
  void *local_2d8;
  iterator iStack_2d0;
  int *local_2c8;
  undefined1 local_2b8 [16];
  Box *local_2a8;
  undefined1 local_298 [16];
  int *local_288;
  ulong local_280;
  ulong local_278;
  ulong local_270;
  undefined1 local_268 [16];
  pointer local_258;
  long local_248;
  Real local_240;
  FabArrayBase *local_238;
  long local_230;
  long local_228;
  double *local_220;
  ulong local_218;
  long local_210;
  DistributionMapping local_208;
  Box local_1f8;
  Real local_1d8 [2];
  double local_1c8;
  Real aRStack_1c0 [3];
  BoxArray local_1a8;
  BoxArray local_140;
  Real local_d8 [4];
  Real local_b8;
  Real RStack_b0;
  undefined8 local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined8 uStack_94;
  Real local_88 [2];
  double local_78;
  uint local_70;
  uint local_6c;
  uint local_68;
  CoordType local_64;
  undefined1 local_58 [16];
  undefined1 auStack_48 [24];
  
  local_d8[0] = (geom->prob_domain).xlo[0];
  local_d8[1] = (geom->prob_domain).xlo[1];
  local_d8[2] = (geom->prob_domain).xlo[2];
  local_d8[3] = (geom->prob_domain).xhi[0];
  local_b8 = (geom->prob_domain).xhi[1];
  RStack_b0 = (geom->prob_domain).xhi[2];
  local_a8 = *(undefined8 *)(geom->domain).smallend.vect;
  uVar2 = *(undefined8 *)(geom->domain).bigend.vect;
  uStack_94 = *(undefined8 *)((geom->domain).bigend.vect + 2);
  uStack_a0 = (undefined4)*(undefined8 *)((geom->domain).smallend.vect + 2);
  uStack_9c = (undefined4)uVar2;
  uStack_98 = (undefined4)((ulong)uVar2 >> 0x20);
  pRVar1 = (geom->super_CoordSys).dx;
  local_88[0] = *pRVar1;
  local_88[1] = (geom->super_CoordSys).dx[1];
  auVar18 = *(undefined1 (*) [16])pRVar1;
  auVar42 = *(undefined1 (*) [16])pRVar1;
  dVar37 = (geom->super_CoordSys).dx[2];
  local_70 = (uint)(byte)(geom->super_CoordSys).field_0x51;
  local_6c = (uint)(byte)(geom->super_CoordSys).field_0x52;
  local_68 = (uint)(byte)(geom->super_CoordSys).field_0x53;
  local_64 = (geom->super_CoordSys).c_sys;
  local_2d8 = (void *)0x0;
  iStack_2d0._M_current = (int *)0x0;
  local_2c8 = (int *)0x0;
  local_1d8[0] = (geom->prob_domain).xlo[0];
  local_1d8[1] = (geom->prob_domain).xlo[1];
  local_1c8 = (geom->prob_domain).xlo[2];
  aRStack_1c0[0] = (geom->prob_domain).xhi[0];
  aRStack_1c0[1] = (geom->prob_domain).xhi[1];
  aRStack_1c0[2] = (geom->prob_domain).xhi[2];
  local_248 = (long)dir;
  local_78 = dVar37;
  local_1d8[local_248] = coord;
  aRStack_1c0[local_248] = coord;
  dVar40 = (geom->prob_domain).xlo[2];
  local_240 = coord;
  dVar36 = floor((local_1c8 - dVar40) / dVar37);
  dVar37 = floor((aRStack_1c0[2] - dVar40) / dVar37);
  local_1f8.btype.itype = 0;
  local_1f8.smallend.vect[2] = (geom->domain).smallend.vect[2];
  if (local_1f8.smallend.vect[2] < (int)dVar36) {
    local_1f8.smallend.vect[2] = (int)dVar36;
  }
  dVar40 = (geom->prob_domain).xlo[0];
  dVar36 = (geom->prob_domain).xlo[1];
  auVar41._0_8_ = aRStack_1c0[0] - dVar40;
  auVar41._8_8_ = aRStack_1c0[1] - dVar36;
  auVar42 = divpd(auVar41,auVar42);
  dVar38 = floor(auVar42._0_8_);
  dStack_340 = auVar42._8_8_;
  dVar39 = floor(dStack_340);
  uVar2 = *(undefined8 *)(geom->domain).smallend.vect;
  auVar42._0_8_ = local_1d8[0] - dVar40;
  auVar42._8_8_ = local_1d8[1] - dVar36;
  auVar42 = divpd(auVar42,auVar18);
  dVar40 = floor(auVar42._0_8_);
  dStack_370 = auVar42._8_8_;
  dVar36 = floor(dStack_370);
  local_348 = (uint)uVar2;
  uStack_344 = (uint)((ulong)uVar2 >> 0x20);
  uVar43 = -(uint)((int)local_348 < (int)dVar40);
  uVar45 = -(uint)((int)uStack_344 < (int)dVar36);
  local_1f8.smallend.vect[0] = ~uVar43 & local_348 | (int)dVar40 & uVar43;
  local_1f8.smallend.vect[1] = ~uVar45 & uStack_344 | (int)dVar36 & uVar45;
  uVar3 = *(ulong *)(geom->domain).bigend.vect;
  uVar44 = CONCAT44(-(uint)((int)dVar39 < (int)(uVar3 >> 0x20)),-(uint)((int)dVar38 < (int)uVar3));
  local_1f8.bigend.vect._0_8_ = ~uVar44 & uVar3 | CONCAT44((int)dVar39,(int)dVar38) & uVar44;
  local_1f8.bigend.vect[2] = (geom->domain).bigend.vect[2];
  if ((int)dVar37 < local_1f8.bigend.vect[2]) {
    local_1f8.bigend.vect[2] = (int)dVar37;
  }
  BoxArray::BoxArray(&local_140,&(cc->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray)
  ;
  local_268 = (undefined1  [16])0x0;
  local_258 = (pointer)0x0;
  BoxArray::intersections
            (&local_140,&local_1f8,
             (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
             local_268,false,0);
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (Box *)0x0;
  local_288 = (int *)0x0;
  local_298 = (undefined1  [16])0x0;
  uVar2 = local_268._8_8_;
  __args = (pointer)local_268._0_8_;
  do {
    local_1a8.m_bat.m_bat_type =
         *(BATType *)
          (*(long *)&(((cc->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.
                       m_ref.
                       super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl + (long)__args->first * 4
          );
    if ((int *)local_298._8_8_ == local_288) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)local_298,(iterator)local_298._8_8_,
                 (int *)&local_1a8);
    }
    else {
      *(BATType *)local_298._8_8_ = local_1a8.m_bat.m_bat_type;
      local_298._8_8_ = (int *)(local_298._8_8_ + 4);
    }
    if ((Box *)local_2b8._8_8_ == local_2a8) {
      std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                ((vector<amrex::Box,std::allocator<amrex::Box>> *)local_2b8,
                 (iterator)local_2b8._8_8_,&__args->second);
    }
    else {
      uVar16 = *(undefined8 *)(__args->second).smallend.vect;
      uVar17 = *(undefined8 *)((__args->second).smallend.vect + 2);
      *(undefined1 (*) [16])(local_2b8._8_8_ + 0xc) = *(undefined1 (*) [16])&(__args->second).bigend
      ;
      *(undefined8 *)((IntVect *)local_2b8._8_8_)->vect = uVar16;
      *(undefined8 *)(((IntVect *)local_2b8._8_8_)->vect + 2) = uVar17;
      local_2b8._8_8_ = (Box *)(local_2b8._8_8_ + 0x1c);
    }
    if (iStack_2d0._M_current == local_2c8) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_2d8,iStack_2d0,&__args->first);
    }
    else {
      *iStack_2d0._M_current = __args->first;
      iStack_2d0._M_current = iStack_2d0._M_current + 1;
    }
    __args = __args + 1;
  } while (__args != (pointer)uVar2);
  BoxArray::BoxArray(&local_1a8,(Box *)local_2b8._0_8_,
                     (int)((ulong)(local_2b8._8_8_ - local_2b8._0_8_) >> 2) * -0x49249249);
  DistributionMapping::DistributionMapping
            (&local_208,(Vector<int,_std::allocator<int>_> *)local_298);
  fabarray_ = (FabArrayBase *)operator_new(0x180);
  local_58._0_8_ = 1;
  stack0xffffffffffffffb0 = (undefined1  [16])0x0;
  auStack_48._8_16_ = (undefined1  [16])0x0;
  MultiFab::MultiFab((MultiFab *)fabarray_,&local_1a8,&local_208,ncomp,0,(MFInfo *)local_58,
                     (cc->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                     super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                     .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                     _M_head_impl);
  *(FabArrayBase **)this = fabarray_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_48);
  if (local_208.m_ref.
      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.m_ref.
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BoxArray::~BoxArray(&local_1a8);
  if ((pointer)local_298._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_298._0_8_,(long)local_288 - local_298._0_8_);
  }
  if ((void *)local_2b8._0_8_ != (void *)0x0) {
    operator_delete((void *)local_2b8._0_8_,(long)local_2a8 - local_2b8._0_8_);
  }
  if ((pointer)local_268._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_268._0_8_,(long)local_258 - local_268._0_8_);
  }
  BoxArray::~BoxArray(&local_140);
  MFIter::MFIter((MFIter *)&local_140,fabarray_,true);
  if (local_140.m_bat.m_op.m_bndryReg.m_loshft.vect[2] <
      local_140.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) {
    local_230 = (long)start_comp;
    local_218 = (ulong)(uint)ncomp;
    local_280 = (ulong)(uint)dir;
    local_238 = fabarray_;
    do {
      lVar24 = (long)local_140.m_bat.m_op.m_bndryReg.m_loshft.vect[2];
      lVar26 = lVar24;
      if ((long *)local_140.m_bat.m_op._60_8_ != (long *)0x0) {
        lVar26 = (long)*(int *)(*(long *)local_140.m_bat.m_op._60_8_ + lVar24 * 4);
      }
      this_00 = *(BaseFab<double> **)
                 (*(long *)((long)&local_238[1].boxarray.m_bat.m_op + 0xc) + lVar26 * 8);
      iVar23 = FabArrayBase::localindex
                         ((FabArrayBase *)cc,
                          *(int *)((long)local_2d8 +
                                  (long)*(int *)(*(long *)local_140.m_bat.m_op._52_8_ + lVar24 * 4)
                                  * 4));
      src = &(cc->super_FabArray<amrex::FArrayBox>).m_fabs_v.
             super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
             super__Vector_impl_data._M_start[iVar23]->super_BaseFab<double>;
      pdVar15 = this_00->dptr;
      iVar23 = (this_00->domain).smallend.vect[0];
      iVar4 = (this_00->domain).smallend.vect[1];
      iVar5 = (this_00->domain).smallend.vect[2];
      iVar6 = (this_00->domain).bigend.vect[0];
      iVar7 = (this_00->domain).bigend.vect[1];
      iVar8 = (this_00->domain).bigend.vect[2];
      local_220 = src->dptr;
      iVar9 = (src->domain).smallend.vect[0];
      iVar10 = (src->domain).smallend.vect[1];
      iVar11 = (src->domain).smallend.vect[2];
      iVar12 = (src->domain).bigend.vect[0];
      iVar13 = (src->domain).bigend.vect[1];
      iVar14 = (src->domain).bigend.vect[2];
      MFIter::tilebox((Box *)&local_1a8,(MFIter *)&local_140);
      uVar22 = local_1a8.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0];
      uVar21 = local_1a8.m_bat.m_op.m_bndryReg.m_typ.itype;
      uVar20 = local_1a8.m_bat.m_op.m_indexType.m_typ.itype;
      BVar19 = local_1a8.m_bat.m_bat_type;
      if (interpolate) {
        lVar26 = (long)(int)local_1a8.m_bat.m_op.m_indexType.m_typ.itype;
        lVar24 = (long)(int)local_1a8.m_bat.m_op.m_bndryReg.m_typ.itype;
        local_270 = (ulong)(uint)local_1a8.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
        local_278 = (ulong)(uint)local_1a8.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2];
        dVar37 = (local_240 - local_d8[local_248]) / local_88[local_248];
        dVar40 = floor(dVar37 + 0.5);
        dVar37 = dVar37 - ((double)((int)dVar40 + -1) + 0.5);
        if (0.5 <= dVar37) {
          if (2 < (uint)dir) goto LAB_0048533a;
          local_360 = (int)*(undefined8 *)(&DAT_0067a438 + local_280 * 8);
          local_350 = (int)*(undefined8 *)(&DAT_0067a450 + local_280 * 8);
          iVar32 = (int)*(undefined8 *)(&DAT_0067a468 + local_280 * 8);
          local_378 = 0;
          local_358 = 0;
          iVar28 = 0;
        }
        else {
          if ((uint)dir < 3) {
            local_378 = (int)*(undefined8 *)(&DAT_0067a3f0 + local_280 * 8);
            local_358 = (int)*(undefined8 *)(&DAT_0067a408 + local_280 * 8);
            iVar28 = (int)*(undefined8 *)(&DAT_0067a420 + local_280 * 8);
          }
          else {
LAB_0048533a:
            local_378 = 0;
            local_358 = 0;
            iVar28 = 0;
          }
          local_360 = 0;
          local_350 = 0;
          iVar32 = 0;
        }
        if (0 < ncomp) {
          lVar33 = (long)((iVar7 - iVar4) + 1);
          lVar34 = (long)((iVar6 - iVar23) + 1);
          lVar35 = (long)((iVar12 - iVar9) + 1);
          lVar27 = ((iVar13 - iVar10) + 1) * lVar35;
          local_228 = ((iVar14 - iVar11) + 1) * lVar27;
          local_300 = (long)pdVar15 +
                      (lVar26 * 8 + (lVar24 - iVar5) * lVar33 * 8 + (long)iVar4 * -8) * lVar34 +
                      (long)(int)BVar19 * 8 + (long)iVar23 * -8;
          lVar33 = lVar33 * lVar34 * 8;
          local_210 = ((iVar8 - iVar5) + 1) * lVar33;
          local_398 = 0;
          do {
            if ((int)uVar21 <= (int)local_278) {
              lVar25 = (local_230 + local_398) * local_228;
              local_388 = local_300;
              local_390 = lVar24;
              do {
                if ((int)uVar20 <= (int)local_270) {
                  lVar30 = local_388;
                  lVar31 = lVar26;
                  do {
                    if ((int)BVar19 <= (int)uVar22) {
                      lVar29 = 0;
                      do {
                        *(double *)(lVar30 + lVar29 * 8) =
                             local_220[lVar25 + (((int)local_390 + local_360) - iVar11) * lVar27 +
                                                (((int)lVar31 + local_350) - iVar10) * lVar35 +
                                                (long)(int)(((iVar32 + BVar19) - iVar9) +
                                                           (int)lVar29)] * (1.0 - dVar37) +
                             local_220[lVar25 + (((int)local_390 + local_358) - iVar11) * lVar27 +
                                                (((int)lVar31 + local_378) - iVar10) * lVar35 +
                                                (long)(int)(((iVar28 + BVar19) - iVar9) +
                                                           (int)lVar29)] * dVar37;
                        lVar29 = lVar29 + 1;
                      } while ((uVar22 - BVar19) + 1 != (int)lVar29);
                    }
                    lVar31 = lVar31 + 1;
                    lVar30 = lVar30 + lVar34 * 8;
                  } while ((int)local_270 + 1 != (int)lVar31);
                }
                local_390 = local_390 + 1;
                local_388 = local_388 + lVar33;
              } while ((int)local_278 + 1 != (int)local_390);
            }
            local_398 = local_398 + 1;
            local_300 = local_300 + local_210;
          } while (local_398 != local_218);
        }
      }
      else {
        BaseFab<double>::copy<(amrex::RunOn)0>
                  (this_00,src,(Box *)&local_1a8,start_comp,(Box *)&local_1a8,0,ncomp);
      }
      MFIter::operator++((MFIter *)&local_140);
    } while (local_140.m_bat.m_op.m_bndryReg.m_loshft.vect[2] <
             local_140.m_bat.m_op.m_bndryReg.m_hishft.vect[1]);
  }
  MFIter::~MFIter((MFIter *)&local_140);
  if (local_2d8 != (void *)0x0) {
    operator_delete(local_2d8,(long)local_2c8 - (long)local_2d8);
  }
  return (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)
         (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)this;
}

Assistant:

std::unique_ptr<MultiFab> get_slice_data(int dir, Real coord, const MultiFab& cc, const Geometry& geom, int start_comp, int ncomp, bool interpolate) {

        BL_PROFILE("amrex::get_slice_data");

        if (interpolate) {
            AMREX_ASSERT(cc.nGrow() >= 1);
        }

        const auto geomdata = geom.data();

        Vector<int> slice_to_full_ba_map;
        std::unique_ptr<MultiFab> slice = allocateSlice(dir, cc, ncomp, geom, coord, slice_to_full_ba_map);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*slice, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            int slice_gid = mfi.index();
            int full_gid = slice_to_full_ba_map[slice_gid];
            auto& slice_fab = (*slice)[mfi];
            auto const& full_fab = cc[full_gid];
            Array4<Real> const& slice_arr = slice_fab.array();
            Array4<Real const> const& full_arr = full_fab.const_array();

            const Box& tile_box  = mfi.tilebox();

            if (interpolate)
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA( tile_box, thread_box,
                {
                    amrex_fill_slice_interp(thread_box, slice_arr, full_arr,
                                            0, start_comp, ncomp,
                                            dir, coord, geomdata);
                });
            }
            else
            {
                slice_fab.copy<RunOn::Device>(full_fab, tile_box, start_comp, tile_box, 0, ncomp);
            }
        }

        return slice;
    }